

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chacha20-poly1305.c
# Opt level: O0

void poly1305_finalise(poly1305 *ctx,uchar *mac)

{
  undefined1 local_30 [8];
  bigval tmp;
  uchar *mac_local;
  poly1305 *ctx_local;
  
  tmp.w[2] = (BignumInt)mac;
  if (ctx->bufferIndex != 0) {
    poly1305_feed_chunk(ctx,ctx->buffer,ctx->bufferIndex);
  }
  bigval_import_le((bigval *)local_30,ctx,0x10);
  bigval_final_reduce(&ctx->h);
  bigval_add((bigval *)local_30,(bigval *)local_30,&ctx->h);
  bigval_export_le((bigval *)local_30,(void *)tmp.w[2],0x10);
  return;
}

Assistant:

static void poly1305_finalise(struct poly1305 *ctx, unsigned char *mac)
{
    bigval tmp;

    if (ctx->bufferIndex) {
        poly1305_feed_chunk(ctx, ctx->buffer, ctx->bufferIndex);
    }

    bigval_import_le(&tmp, ctx->nonce, 16);
    bigval_final_reduce(&ctx->h);
    bigval_add(&tmp, &tmp, &ctx->h);
    bigval_export_le(&tmp, mac, 16);
}